

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cf-h2-proxy.c
# Opt level: O0

_Bool proxy_h2_connisalive(Curl_cfilter *cf,Curl_easy *data,_Bool *input_pending)

{
  _Bool _Var1;
  int iVar2;
  ssize_t sVar3;
  ssize_t nread;
  CURLcode result;
  _Bool alive;
  cf_h2_proxy_ctx *ctx;
  _Bool *input_pending_local;
  Curl_easy *data_local;
  Curl_cfilter *cf_local;
  
  _result = (cf_h2_proxy_ctx *)cf->ctx;
  nread._7_1_ = 1;
  *input_pending = false;
  if ((cf->next == (Curl_cfilter *)0x0) ||
     (ctx = (cf_h2_proxy_ctx *)input_pending, input_pending_local = (_Bool *)data,
     data_local = (Curl_easy *)cf, _Var1 = (*cf->next->cft->is_alive)(cf->next,data,input_pending),
     !_Var1)) {
    cf_local._7_1_ = false;
  }
  else {
    if (((ulong)ctx->h2 & 1) != 0) {
      *(undefined1 *)&ctx->h2 = 0;
      sVar3 = Curl_bufq_slurp(&_result->inbufq,proxy_nw_in_reader,data_local,(CURLcode *)&nread);
      if (sVar3 == -1) {
        if ((int)nread != 0x51) {
          nread._7_1_ = 0;
        }
      }
      else {
        iVar2 = proxy_h2_process_pending_input
                          ((Curl_cfilter *)data_local,(Curl_easy *)input_pending_local,
                           (CURLcode *)&nread);
        if (iVar2 < 0) {
          nread._7_1_ = 0;
        }
        else {
          iVar2 = proxy_h2_should_close_session(_result);
          nread._7_1_ = iVar2 == 0;
        }
      }
    }
    cf_local._7_1_ = (_Bool)(nread._7_1_ & 1);
  }
  return cf_local._7_1_;
}

Assistant:

static bool proxy_h2_connisalive(struct Curl_cfilter *cf,
                                 struct Curl_easy *data,
                                 bool *input_pending)
{
  struct cf_h2_proxy_ctx *ctx = cf->ctx;
  bool alive = TRUE;

  *input_pending = FALSE;
  if(!cf->next || !cf->next->cft->is_alive(cf->next, data, input_pending))
    return FALSE;

  if(*input_pending) {
    /* This happens before we've sent off a request and the connection is
       not in use by any other transfer, there shouldn't be any data here,
       only "protocol frames" */
    CURLcode result;
    ssize_t nread = -1;

    *input_pending = FALSE;
    nread = Curl_bufq_slurp(&ctx->inbufq, proxy_nw_in_reader, cf, &result);
    if(nread != -1) {
      if(proxy_h2_process_pending_input(cf, data, &result) < 0)
        /* immediate error, considered dead */
        alive = FALSE;
      else {
        alive = !proxy_h2_should_close_session(ctx);
      }
    }
    else if(result != CURLE_AGAIN) {
      /* the read failed so let's say this is dead anyway */
      alive = FALSE;
    }
  }

  return alive;
}